

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufPerformOne(Buf_Man_t *p,int iPivot,int fSkipDup,int fVerbose)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Abc_Obj_t *pAVar11;
  char *pcVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pAVar14;
  Mio_Gate_t *pMVar15;
  double dVar16;
  int local_bc;
  int iFirstBuf;
  int nFirst;
  int n1Number;
  int n1Degree;
  int nDegree;
  Abc_Obj_t *pClone;
  Abc_Obj_t *pBuffer;
  int nNonCrit;
  int nCrit;
  int j;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  int fSkipDup_local;
  int iPivot_local;
  Buf_Man_t *p_local;
  
  iVar1 = Abc_NtkObjNumMax(p->pNtk);
  if (p->nObjAlloc <= iVar1 + 0x1e) {
    __assert_fail("Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x36a,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
  }
  pAVar11 = Abc_NtkObj(p->pNtk,iPivot);
  iVar1 = Abc_BufCountNonCritical(p,pAVar11);
  iVar2 = Abc_ObjFanoutNum(pAVar11);
  uVar3 = iVar2 - iVar1;
  if (fVerbose != 0) {
    uVar4 = Abc_ObjId(pAVar11);
    pcVar12 = Mio_GateReadName((Mio_Gate_t *)(pAVar11->field_5).pData);
    uVar5 = Abc_ObjFaninNum(pAVar11);
    uVar6 = Abc_ObjFanoutNum(pAVar11);
    printf("ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ",(ulong)uVar4,pcVar12,(ulong)uVar5
           ,(ulong)uVar6,(ulong)uVar3);
  }
  if (((int)uVar3 < 1) || (iVar1 < 2)) {
    if ((fSkipDup == 0) &&
       (((0 < (int)uVar3 && (iVar1 = Abc_ObjIsNode(pAVar11), iVar1 != 0)) &&
        (iVar1 = Abc_ObjFanoutNum(pAVar11), p->nFanMin < iVar1)))) {
      pAVar13 = Abc_NtkDupObj(p->pNtk,pAVar11,0);
      for (nCrit = 0; iVar1 = Abc_ObjFaninNum(pAVar11), nCrit < iVar1; nCrit = nCrit + 1) {
        pAVar14 = Abc_ObjFanin(pAVar11,nCrit);
        Abc_ObjAddFanin(pAVar13,pAVar14);
      }
      Abc_NodeCollectFanouts(pAVar11,p->vFanouts);
      for (nCrit = 0; iVar1 = Vec_PtrSize(p->vFanouts), nCrit < iVar1 / 2; nCrit = nCrit + 1) {
        pAVar14 = (Abc_Obj_t *)Vec_PtrEntry(p->vFanouts,nCrit);
        Abc_ObjPatchFanin(pAVar14,pAVar11,pAVar13);
      }
      Abc_BufCreateEdges(p,pAVar13);
      iVar1 = Abc_BufNodeArr(p,pAVar11);
      Abc_BufSetNodeArr(p,pAVar13,iVar1);
      Abc_BufUpdateDep(p,pAVar11);
      Abc_BufUpdateDep(p,pAVar13);
      Abc_BufAddToQue(p,pAVar11);
      Abc_BufAddToQue(p,pAVar13);
      for (nCrit = 0; iVar1 = Abc_ObjFaninNum(pAVar11), nCrit < iVar1; nCrit = nCrit + 1) {
        pAVar14 = Abc_ObjFanin(pAVar11,nCrit);
        Abc_BufAddToQue(p,pAVar14);
      }
      Abc_SclTimeIncUpdateLevel(pAVar13);
      p->nDuplicate = p->nDuplicate + 1;
      if (fVerbose != 0) {
        printf("Duplicating node\n");
      }
    }
    else if ((((int)uVar3 < 1) || (iVar1 = Abc_ObjFanoutNum(pAVar11), iVar1 < 9)) &&
            (iVar1 = Abc_ObjFanoutNum(pAVar11), iVar1 <= p->nFanMax)) {
      if (fVerbose != 0) {
        printf("Doing nothing\n");
      }
    }
    else {
      iVar1 = Abc_NtkObjNumMax(p->pNtk);
      iVar2 = Abc_ObjFanoutNum(pAVar11);
      dVar16 = pow((double)iVar2,0.5);
      uVar4 = Abc_MinInt(10,(int)dVar16);
      iVar2 = Abc_ObjFanoutNum(pAVar11);
      iVar7 = iVar2 / (int)uVar4 + 1;
      iVar8 = Abc_ObjFanoutNum(pAVar11);
      iVar9 = iVar7 * (iVar8 % (int)uVar4);
      p->nBranchCrit = (uint)(0 < (int)uVar3) + p->nBranchCrit;
      Abc_NodeCollectFanouts(pAVar11,p->vFanouts);
      iVar10 = Abc_ObjIsNode(pAVar11);
      if ((iVar10 == 0) || (iVar10 = Abc_NodeIsBuf(pAVar11), iVar10 == 0)) {
        p->nBranch1 = p->nBranch1 + 1;
        for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
          Abc_NtkCreateNodeBuf(p->pNtk,pAVar11);
        }
        if (fVerbose != 0) {
          printf("Adding %d buffers\n",(ulong)uVar4);
        }
      }
      else {
        p->nBranch0 = p->nBranch0 + 1;
        pMVar15 = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
        (pAVar11->field_5).pData = pMVar15;
        Abc_BufSetEdgeDelay(p,pAVar11,0,1000);
        iVar10 = Abc_NodeIsInv(pAVar11);
        if (iVar10 == 0) {
          __assert_fail("Abc_NodeIsInv(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                        ,0x3b1,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
        }
        for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
          Abc_NtkCreateNodeInv(p->pNtk,pAVar11);
        }
        if (fVerbose != 0) {
          printf("Adding %d inverters\n",(ulong)uVar4);
        }
      }
      for (nCrit = 0; iVar10 = Vec_PtrSize(p->vFanouts), nCrit < iVar10; nCrit = nCrit + 1) {
        pAVar13 = (Abc_Obj_t *)Vec_PtrEntry(p->vFanouts,nCrit);
        if (nCrit < iVar9) {
          local_bc = nCrit / iVar7;
        }
        else {
          local_bc = iVar8 % (int)uVar4 + (nCrit - iVar9) / (iVar2 / (int)uVar4);
        }
        if ((local_bc < 0) || ((int)uVar4 <= local_bc)) {
          __assert_fail("j >= 0 && j < nDegree",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                        ,0x3c3,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
        }
        pAVar14 = Abc_NtkObj(p->pNtk,iVar1 + local_bc);
        Abc_ObjPatchFanin(pAVar13,pAVar11,pAVar14);
      }
      for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
        pAVar13 = Abc_NtkObj(p->pNtk,iVar1 + nCrit);
        Abc_BufCreateEdges(p,pAVar13);
      }
      Abc_BufUpdateArr(p,pAVar11);
      for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
        pAVar13 = Abc_NtkObj(p->pNtk,iVar1 + nCrit);
        Abc_BufComputeDep(p,pAVar13);
      }
      Abc_BufUpdateDep(p,pAVar11);
      for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
        pAVar11 = Abc_NtkObj(p->pNtk,iVar1 + nCrit);
        Abc_BufAddToQue(p,pAVar11);
      }
      for (nCrit = 0; nCrit < (int)uVar4; nCrit = nCrit + 1) {
        pAVar11 = Abc_NtkObj(p->pNtk,iVar1 + nCrit);
        Abc_SclTimeIncUpdateLevel(pAVar11);
      }
    }
  }
  else {
    pAVar13 = Abc_NtkCreateNodeBuf(p->pNtk,pAVar11);
    for (nCrit = 0; iVar1 = Vec_IntSize(p->vNonCrit), nCrit < iVar1; nCrit = nCrit + 1) {
      pNtk = p->pNtk;
      iVar1 = Vec_IntEntry(p->vNonCrit,nCrit);
      pAVar14 = Abc_NtkObj(pNtk,iVar1);
      if (pAVar14 != (Abc_Obj_t *)0x0) {
        Abc_ObjPatchFanin(pAVar14,pAVar11,pAVar13);
      }
    }
    Abc_BufCreateEdges(p,pAVar13);
    Abc_BufUpdateArr(p,pAVar13);
    Abc_BufUpdateDep(p,pAVar13);
    Abc_BufAddToQue(p,pAVar11);
    Abc_BufAddToQue(p,pAVar13);
    Abc_SclTimeIncUpdateLevel(pAVar13);
    p->nSeparate = p->nSeparate + 1;
    if (fVerbose != 0) {
      printf("Adding buffer\n");
    }
  }
  return;
}

Assistant:

void Abc_BufPerformOne( Buf_Man_t * p, int iPivot, int fSkipDup, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, j, nCrit, nNonCrit;
//    int DelayMax = p->DelayMax;
    assert( Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc );
    pObj     = Abc_NtkObj( p->pNtk, iPivot );
//    assert( Vec_FltEntry(p->vCounts, iPivot) == (float)Abc_ObjFanoutNum(pObj) );
    nNonCrit = Abc_BufCountNonCritical( p, pObj );
    nCrit    = Abc_ObjFanoutNum(pObj) - nNonCrit;
if ( fVerbose )
{
//Abc_BufPrintOne( p, iPivot );
printf( "ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ", 
    Abc_ObjId(pObj), Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), nCrit );
}
    // consider three cases
    if ( nCrit > 0 && nNonCrit > 1 )
    {
        // (1) both critical and non-critical are present - split them by adding buffer
        Abc_Obj_t * pBuffer = Abc_NtkCreateNodeBuf( p->pNtk, pObj );
        Abc_NtkForEachObjVec( p->vNonCrit, p->pNtk, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        // update timing
        Abc_BufCreateEdges( p, pBuffer );
        Abc_BufUpdateArr( p, pBuffer );
        Abc_BufUpdateDep( p, pBuffer );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pBuffer );
        Abc_SclTimeIncUpdateLevel( pBuffer );
        p->nSeparate++;
if ( fVerbose )
printf( "Adding buffer\n" );
    }
    else if ( !fSkipDup && nCrit > 0 && Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > p->nFanMin )//&& Abc_ObjLevel(pObj) < 4 )//&& Abc_ObjFaninNum(pObj) < 2 )
    {
        // (2) only critical are present - duplicate
        Abc_Obj_t * pClone = Abc_NtkDupObj( p->pNtk, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_ObjAddFanin( pClone, pFanout );
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        Vec_PtrForEachEntryStop( Abc_Obj_t *, p->vFanouts, pFanout, i, Vec_PtrSize(p->vFanouts)/2 )
            Abc_ObjPatchFanin( pFanout, pObj, pClone );
        // update timing
        Abc_BufCreateEdges( p, pClone );
        Abc_BufSetNodeArr( p, pClone, Abc_BufNodeArr(p, pObj) );
        Abc_BufUpdateDep( p, pObj );
        Abc_BufUpdateDep( p, pClone );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pClone );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_BufAddToQue( p, pFanout );
        Abc_SclTimeIncUpdateLevel( pClone );
        p->nDuplicate++;
//        printf( "Duplicating %s on level %d\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjLevel(pObj) );
if ( fVerbose )
printf( "Duplicating node\n" );
    }
    else if ( (nCrit > 0 && Abc_ObjFanoutNum(pObj) > 8) || Abc_ObjFanoutNum(pObj) > p->nFanMax )
    {
        // (2) only critical or only non-critical - add buffer/inverter tree
        int nDegree, n1Degree, n1Number, nFirst;
        int iFirstBuf = Abc_NtkObjNumMax( p->pNtk );
//        nDegree  = Abc_MinInt( 3, (int)pow(Abc_ObjFanoutNum(pObj), 0.34) );
        nDegree  = Abc_MinInt( 10, (int)pow(Abc_ObjFanoutNum(pObj), 0.5) );
        n1Degree = Abc_ObjFanoutNum(pObj) / nDegree + 1;
        n1Number = Abc_ObjFanoutNum(pObj) % nDegree;
        nFirst   = n1Degree * n1Number;
        p->nBranchCrit += (nCrit > 0);
        // create inverters
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        if ( Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj) )
        {
            p->nBranch0++;
            pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
            Abc_BufSetEdgeDelay( p, pObj, 0, BUF_SCALE );
            assert( Abc_NodeIsInv(pObj) );
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeInv( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d inverters\n", nDegree );
        }
        else
        {
            p->nBranch1++;
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeBuf( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d buffers\n", nDegree );
        }
        // connect inverters
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, i )
        {
            j = (i < nFirst) ? i/n1Degree : n1Number + ((i - nFirst)/(n1Degree - 1));
            assert( j >= 0 && j < nDegree );
            Abc_ObjPatchFanin( pFanout, pObj, Abc_NtkObj(p->pNtk, iFirstBuf + j) );
        }
        // update timing
        for ( i = 0; i < nDegree; i++ )
            Abc_BufCreateEdges( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateArr( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufComputeDep( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateDep( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufAddToQue( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        for ( i = 0; i < nDegree; i++ )
            Abc_SclTimeIncUpdateLevel( Abc_NtkObj(p->pNtk, iFirstBuf + i) );
    }
    else
    {
if ( fVerbose )
printf( "Doing nothing\n" );
    }
//    if ( DelayMax != p->DelayMax )
//        printf( "%d (%.2f)  ", p->DelayMax, 1.0 * p->DelayMax * p->DelayInv / BUF_SCALE );
}